

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserInputPtr xmlNewPushInput(char *url,char *chunk,int size)

{
  int iVar1;
  xmlParserInputBufferPtr buf_00;
  int res;
  xmlParserInputPtr input;
  xmlParserInputBufferPtr buf;
  int size_local;
  char *chunk_local;
  char *url_local;
  
  buf_00 = xmlAllocParserInputBuffer(XML_CHAR_ENCODING_NONE);
  if (buf_00 == (xmlParserInputBufferPtr)0x0) {
    url_local = (char *)0x0;
  }
  else {
    url_local = (char *)xmlNewInputInternal(buf_00,url);
    if ((xmlParserInputPtr)url_local == (xmlParserInputPtr)0x0) {
      url_local = (char *)0x0;
    }
    else {
      ((xmlParserInputPtr)url_local)->flags = ((xmlParserInputPtr)url_local)->flags | 0x40;
      if ((0 < size) && (chunk != (char *)0x0)) {
        iVar1 = xmlParserInputBufferPush(((xmlParserInputPtr)url_local)->buf,size,chunk);
        xmlBufResetInput(((xmlParserInputPtr)url_local)->buf->buffer,(xmlParserInputPtr)url_local);
        if (iVar1 < 0) {
          xmlFreeInputStream((xmlParserInputPtr)url_local);
          url_local = (char *)0x0;
        }
      }
    }
  }
  return (xmlParserInputPtr)url_local;
}

Assistant:

xmlParserInputPtr
xmlNewPushInput(const char *url, const char *chunk, int size) {
    xmlParserInputBufferPtr buf;
    xmlParserInputPtr input;

    buf = xmlAllocParserInputBuffer(XML_CHAR_ENCODING_NONE);
    if (buf == NULL)
        return(NULL);

    input = xmlNewInputInternal(buf, url);
    if (input == NULL)
	return(NULL);

    input->flags |= XML_INPUT_PROGRESSIVE;

    if ((size > 0) && (chunk != NULL)) {
        int res;

	res = xmlParserInputBufferPush(input->buf, size, chunk);
        xmlBufResetInput(input->buf->buffer, input);
        if (res < 0) {
            xmlFreeInputStream(input);
            return(NULL);
        }
    }

    return(input);
}